

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O0

ngram_model_t * ngram_model_set_remove(ngram_model_t *base,char *name,int reuse_widmap)

{
  uint32 *puVar1;
  int iVar2;
  float64 fVar3;
  int local_48;
  float32 fprob;
  int32 i;
  int32 n;
  int32 scale;
  int32 lmidx;
  ngram_model_t *submodel;
  ngram_model_set_t *set;
  int reuse_widmap_local;
  char *name_local;
  ngram_model_t *base_local;
  
  n = 0;
  while ((n < base[1].refcount &&
         (iVar2 = strcmp(name,*(char **)(*(long *)&base[1].n_1g_alloc + (long)n * 8)), iVar2 != 0)))
  {
    n = n + 1;
  }
  if (n == base[1].refcount) {
    base_local = (ngram_model_t *)0x0;
  }
  else {
    base_local = *(ngram_model_t **)(base[1].n_counts + (long)n * 2);
    fVar3 = logmath_exp(base->lmath,*(int *)(*(long *)&base[1].n + (long)n * 4));
    iVar2 = logmath_log(base->lmath,(float64)(1.0 - (double)(float)(double)fVar3));
    base[1].refcount = base[1].refcount + -1;
    fprob = 0.0;
    ckd_free(*(void **)(*(long *)&base[1].n_1g_alloc + (long)n * 8));
    *(undefined8 *)(*(long *)&base[1].n_1g_alloc + (long)n * 8) = 0;
    for (local_48 = 0; local_48 < base[1].refcount; local_48 = local_48 + 1) {
      if (n <= local_48) {
        *(undefined8 *)(base[1].n_counts + (long)local_48 * 2) =
             *(undefined8 *)(base[1].n_counts + (long)(local_48 + 1) * 2);
        *(undefined8 *)(*(long *)&base[1].n_1g_alloc + (long)local_48 * 8) =
             *(undefined8 *)(*(long *)&base[1].n_1g_alloc + (long)(local_48 + 1) * 8);
        *(undefined4 *)(*(long *)&base[1].n + (long)local_48 * 4) =
             *(undefined4 *)(*(long *)&base[1].n + (long)(local_48 + 1) * 4);
      }
      *(int *)(*(long *)&base[1].n + (long)local_48 * 4) =
           *(int *)(*(long *)&base[1].n + (long)local_48 * 4) - iVar2;
      if ((uint)fprob < (uint)*(byte *)(*(long *)(base[1].n_counts + (long)local_48 * 2) + 0x18)) {
        fprob = (float32)(uint)*(byte *)(*(long *)(base[1].n_counts + (long)local_48 * 2) + 0x18);
      }
    }
    puVar1 = base[1].n_counts;
    iVar2 = base[1].refcount;
    (puVar1 + (long)iVar2 * 2)[0] = 0;
    (puVar1 + (long)iVar2 * 2)[1] = 0;
    *(int32 *)(*(long *)&base[1].n + (long)base[1].refcount * 4) = base->log_zero;
    if (reuse_widmap == 0) {
      build_widmap(base,base->lmath,(int32)fprob);
    }
    else {
      for (local_48 = 0; local_48 < base->n_words; local_48 = local_48 + 1) {
        memmove((void *)((long)(&((base[1].lmath)->t).table)[local_48] + (long)n * 4),
                (void *)((long)(&((base[1].lmath)->t).table)[local_48] + (long)n * 4 + 4),
                (long)(base[1].refcount - n) << 2);
      }
    }
  }
  return base_local;
}

Assistant:

ngram_model_t *
ngram_model_set_remove(ngram_model_t * base,
                       const char *name, int reuse_widmap)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    ngram_model_t *submodel;
    int32 lmidx, scale, n, i;
    float32 fprob;

    for (lmidx = 0; lmidx < set->n_models; ++lmidx)
        if (0 == strcmp(name, set->names[lmidx]))
            break;
    if (lmidx == set->n_models)
        return NULL;
    submodel = set->lms[lmidx];

    /* Renormalize the interpolation weights by scaling them by
     * 1/(1-fprob) */
    fprob = (float32) logmath_exp(base->lmath, set->lweights[lmidx]);
    scale = logmath_log(base->lmath, 1.0 - fprob);

    /* Remove it from the array of lms, renormalize remaining weights,
     * and recalcluate n. */
    --set->n_models;
    n = 0;
    ckd_free(set->names[lmidx]);
    set->names[lmidx] = NULL;
    for (i = 0; i < set->n_models; ++i) {
        if (i >= lmidx) {
            set->lms[i] = set->lms[i + 1];
            set->names[i] = set->names[i + 1];
            set->lweights[i] = set->lweights[i + 1];
        }
        set->lweights[i] -= scale;
        if (set->lms[i]->n > n)
            n = set->lms[i]->n;
    }
    /* There's no need to shrink these arrays. */
    set->lms[set->n_models] = NULL;
    set->lweights[set->n_models] = base->log_zero;
    /* No need to shrink maphist either. */

    /* Reuse the existing word ID mapping if requested. */
    if (reuse_widmap) {
        /* Just go through and shrink each row. */
        for (i = 0; i < base->n_words; ++i) {
            memmove(set->widmap[i] + lmidx, set->widmap[i] + lmidx + 1,
                    (set->n_models - lmidx) * sizeof(**set->widmap));
        }
    }
    else {
        build_widmap(base, base->lmath, n);
    }
    return submodel;
}